

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O3

int field_with_index(char *opcode_bits,int index)

{
  BOOL BVar1;
  int which;
  PatternRange range;
  PatternRange local_30;
  
  which = 1;
  BVar1 = pattern_range(opcode_bits,1,&local_30);
  if (BVar1 != FALSE) {
    do {
      if (local_30.index == index) {
        return which;
      }
      which = which + 1;
      BVar1 = pattern_range(opcode_bits,which,&local_30);
    } while (BVar1 != FALSE);
  }
  return 0;
}

Assistant:

int
field_with_index (const char *opcode_bits, int index)
{
  PatternRange range;
  int i;

  for (i = 1; pattern_range (opcode_bits, i, &range); i++)
    {
      if (range.index == index)
	return i;
    }
  return 0;
}